

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

Layer * ncnn::Yolov3DetectionOutput_layer_creator(void)

{
  Layer *pLVar1;
  Yolov3DetectionOutput *in_stack_00000910;
  
  pLVar1 = (Layer *)operator_new(0x160);
  Yolov3DetectionOutput::Yolov3DetectionOutput(in_stack_00000910);
  return pLVar1;
}

Assistant:

Yolov3DetectionOutput::Yolov3DetectionOutput()
{
    one_blob_only = false;
    support_inplace = false;
    
    //softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    //softmax->load_param(pd);
}